

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_walls_draw.cpp
# Opt level: O2

void __thiscall GLWall::MakeVertices(GLWall *this,bool nosplit)

{
  float fVar1;
  undefined8 uVar2;
  side_t *psVar3;
  float fVar4;
  uint uVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  FFlatVertex *local_28;
  
  if (this->vertcount != 0) {
    return;
  }
  if (((!gl_seamless.Value || nosplit) || (psVar3 = this->seg->sidedef, psVar3 == (side_t *)0x0)) ||
     ((psVar3->Flags & 0x40) != 0)) {
    bVar6 = false;
  }
  else {
    bVar6 = (this->flags & 0x40) == 0;
  }
  fVar8 = (this->glseg).x1;
  fVar7 = (this->glseg).y1;
  fVar1 = this->tcs[0].u;
  fVar4 = this->tcs[0].v;
  uVar2 = *(undefined8 *)this->zbottom;
  local_28 = GLRenderer->mVBO->map + (ulong)GLRenderer->mVBO->mCurIndex + 1;
  local_28[-1].x = fVar8;
  local_28[-1].z = (float)uVar2;
  local_28[-1].y = fVar7;
  local_28[-1].u = fVar1;
  local_28[-1].v = fVar4;
  if ((bVar6) && ((this->glseg).fracleft == 0.0)) {
    SplitLeftEdge(this,&local_28);
    fVar8 = (this->glseg).x1;
    fVar7 = (this->glseg).y1;
  }
  fVar1 = this->ztop[0];
  local_28->x = fVar8;
  local_28->z = fVar1;
  local_28->y = fVar7;
  fVar8 = this->tcs[1].v;
  local_28->u = this->tcs[1].u;
  local_28->v = fVar8;
  local_28 = local_28 + 1;
  if ((bVar6) && ((this->flags & 0x10) == 0)) {
    SplitUpperEdge(this,&local_28);
  }
  fVar8 = (this->glseg).x2;
  fVar7 = (this->glseg).y2;
  fVar1 = this->tcs[2].u;
  fVar4 = this->tcs[2].v;
  uVar2 = *(undefined8 *)(this->ztop + 1);
  local_28->x = fVar8;
  local_28->z = (float)uVar2;
  local_28->y = fVar7;
  local_28->u = fVar1;
  local_28->v = fVar4;
  local_28 = local_28 + 1;
  if ((bool)((this->glseg).fracright == 1.0 & bVar6)) {
    SplitRightEdge(this,&local_28);
    fVar8 = (this->glseg).x2;
    fVar7 = (this->glseg).y2;
  }
  fVar1 = this->zbottom[1];
  local_28->x = fVar8;
  local_28->z = fVar1;
  local_28->y = fVar7;
  fVar8 = this->tcs[3].v;
  local_28->u = this->tcs[3].u;
  local_28->v = fVar8;
  local_28 = local_28 + 1;
  if ((bVar6) && ((this->flags & 0x20) == 0)) {
    SplitLowerEdge(this,&local_28);
  }
  uVar5 = FFlatVertexBuffer::GetCount(GLRenderer->mVBO,local_28,&this->vertindex);
  this->vertcount = uVar5;
  return;
}

Assistant:

void GLWall::MakeVertices(bool nosplit)
{
	if (vertcount == 0)
	{
		bool split = (gl_seamless && !nosplit && seg->sidedef != NULL && !(seg->sidedef->Flags & WALLF_POLYOBJ) && !(flags & GLWF_NOSPLIT));

		FFlatVertex *ptr = GLRenderer->mVBO->GetBuffer();

		ptr->Set(glseg.x1, zbottom[0], glseg.y1, tcs[LOLFT].u, tcs[LOLFT].v);
		ptr++;
		if (split && glseg.fracleft == 0) SplitLeftEdge(ptr);
		ptr->Set(glseg.x1, ztop[0], glseg.y1, tcs[UPLFT].u, tcs[UPLFT].v);
		ptr++;
		if (split && !(flags & GLWF_NOSPLITUPPER)) SplitUpperEdge(ptr);
		ptr->Set(glseg.x2, ztop[1], glseg.y2, tcs[UPRGT].u, tcs[UPRGT].v);
		ptr++;
		if (split && glseg.fracright == 1) SplitRightEdge(ptr);
		ptr->Set(glseg.x2, zbottom[1], glseg.y2, tcs[LORGT].u, tcs[LORGT].v);
		ptr++;
		if (split && !(flags & GLWF_NOSPLITLOWER)) SplitLowerEdge(ptr);
		vertcount = GLRenderer->mVBO->GetCount(ptr, &vertindex);
	}
}